

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpString(xmlDebugCtxtPtr ctxt,xmlChar *str)

{
  int local_1c;
  int i;
  xmlChar *str_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (ctxt->check == 0) {
    if (str == (xmlChar *)0x0) {
      fprintf((FILE *)ctxt->output,"(NULL)");
    }
    else {
      for (local_1c = 0; local_1c < 0x28; local_1c = local_1c + 1) {
        if (str[local_1c] == '\0') {
          return;
        }
        if ((str[local_1c] == ' ') ||
           (((8 < str[local_1c] && (str[local_1c] < 0xb)) || (str[local_1c] == '\r')))) {
          fputc(0x20,(FILE *)ctxt->output);
        }
        else if (str[local_1c] < 0x80) {
          fputc((uint)str[local_1c],(FILE *)ctxt->output);
        }
        else {
          fprintf((FILE *)ctxt->output,"#%X",(ulong)str[local_1c]);
        }
      }
      fprintf((FILE *)ctxt->output,"...");
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpString(xmlDebugCtxtPtr ctxt, const xmlChar * str)
{
    int i;

    if (ctxt->check) {
        return;
    }
    /* TODO: check UTF8 content of the string */
    if (str == NULL) {
        fprintf(ctxt->output, "(NULL)");
        return;
    }
    for (i = 0; i < 40; i++)
        if (str[i] == 0)
            return;
        else if (IS_BLANK_CH(str[i]))
            fputc(' ', ctxt->output);
        else if (str[i] >= 0x80)
            fprintf(ctxt->output, "#%X", str[i]);
        else
            fputc(str[i], ctxt->output);
    fprintf(ctxt->output, "...");
}